

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_set_format.c
# Opt level: O0

void test_read_append_filter_wrong_program(void)

{
  wchar_t wVar1;
  archive *paVar2;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  archive *a;
  archive_entry *ae;
  archive *in_stack_00000018;
  void *in_stack_00000020;
  char *in_stack_ffffffffffffffe8;
  archive *a_00;
  wchar_t in_stack_fffffffffffffff8;
  wchar_t in_stack_fffffffffffffffc;
  
  wVar1 = canRunCommand((char *)0x1c7ee0);
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'Ð');
    test_skipping("Can\'t run bunzip2 program on this platform");
  }
  else {
    paVar2 = archive_read_new();
    assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                     in_stack_fffffffffffffff8,(char *)paVar2,in_stack_ffffffffffffffe8);
    archive_read_set_format(in_stack_00000018,ae._4_4_);
    assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                     in_stack_fffffffffffffff8,(char *)paVar2,in_stack_ffffffffffffffe8);
    archive_read_append_filter_program(paVar2,in_stack_ffffffffffffffe8);
    a_00 = paVar2;
    assertion_equal_int((char *)a,unaff_retaddr_00,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar2
                        ,(longlong)paVar2,(char *)0x1c7fb6,in_stack_00000020);
    archive_read_open_memory(a_00,paVar2,0x1c7fcc);
    paVar2 = a_00;
    assertion_equal_int((char *)a,unaff_retaddr_00,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)a_00,
                        (longlong)a_00,(char *)0x1c7ffb,in_stack_00000020);
    archive_read_next_header(paVar2,(archive_entry **)a_00);
    assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                     in_stack_fffffffffffffff8,(char *)paVar2,a_00);
    archive_read_close((archive *)0x1c803c);
    assertion_equal_int((char *)a,unaff_retaddr_00,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar2
                        ,(longlong)paVar2,(char *)0x1c806e,in_stack_00000020);
    archive_read_free((archive *)0x1c8078);
    assertion_equal_int((char *)a,unaff_retaddr_00,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar2
                        ,0,(char *)0x1c80a6,in_stack_00000020);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_append_filter_wrong_program)
{
  struct archive_entry *ae;
  struct archive *a;

  /*
   * If we have "bunzip2 -q", try using that.
   */
  if (!canRunCommand("bunzip2 -V")) {
    skipping("Can't run bunzip2 program on this platform");
    return;
  }
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_set_format(a, ARCHIVE_FORMAT_TAR));
  assertEqualIntA(a, ARCHIVE_OK,
      archive_read_append_filter_program(a, "bunzip2 -q"));
  assertEqualIntA(a, ARCHIVE_OK,
      archive_read_open_memory(a, archive, sizeof(archive)));
  assertA(archive_read_next_header(a, &ae) < (ARCHIVE_WARN));
  assertEqualIntA(a, ARCHIVE_WARN, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}